

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O1

void spdlog::set_pattern(string *pattern,pattern_time_type time_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_70;
  string local_68;
  string local_48;
  
  local_70._M_head_impl = (formatter *)operator_new(0xa8);
  local_68._M_dataplus._M_p = (pattern->_M_dataplus)._M_p;
  paVar1 = &pattern->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68.field_2._8_4_ = *(undefined4 *)((long)&pattern->field_2 + 8);
    local_68.field_2._12_4_ = *(undefined4 *)((long)&pattern->field_2 + 0xc);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_68._M_string_length = pattern->_M_string_length;
  (pattern->_M_dataplus)._M_p = (pointer)paVar1;
  pattern->_M_string_length = 0;
  (pattern->field_2)._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"\n","");
  pattern_formatter::pattern_formatter
            ((pattern_formatter *)local_70._M_head_impl,&local_68,time_type,&local_48);
  set_formatter((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_70)
  ;
  if ((pattern_formatter *)local_70._M_head_impl != (pattern_formatter *)0x0) {
    (*((formatter *)&(local_70._M_head_impl)->_vptr_formatter)->_vptr_formatter[1])();
  }
  local_70._M_head_impl = (formatter *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

SPDLOG_INLINE void set_pattern(std::string pattern, pattern_time_type time_type)
{
    set_formatter(std::unique_ptr<spdlog::formatter>(new pattern_formatter(std::move(pattern), time_type)));
}